

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcAirToAirHeatRecoveryType::~IfcAirToAirHeatRecoveryType
          (IfcAirToAirHeatRecoveryType *this)

{
  ~IfcAirToAirHeatRecoveryType
            ((IfcAirToAirHeatRecoveryType *)
             ((long)&(this->super_IfcEnergyConversionDeviceType).
                     super_IfcDistributionFlowElementType.super_IfcDistributionElementType.
                     super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.field_0x0 +
             *(long *)(*(long *)&(this->super_IfcEnergyConversionDeviceType).
                                 super_IfcDistributionFlowElementType.
                                 super_IfcDistributionElementType.super_IfcElementType.
                                 super_IfcTypeProduct.super_IfcTypeObject + -0x18)));
  return;
}

Assistant:

IfcAirToAirHeatRecoveryType() : Object("IfcAirToAirHeatRecoveryType") {}